

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O1

void __thiscall QMessageBox::QMessageBox(QMessageBox *this,QWidget *parent)

{
  QDialogPrivate *this_00;
  long in_FS_OFFSET;
  QArrayData *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QDialogPrivate *)operator_new(0x3b0);
  QDialogPrivate::QDialogPrivate(this_00);
  *(undefined ***)&this_00->super_QWidgetPrivate = &PTR__QMessageBoxPrivate_00812a90;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x20 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x28 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x30 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x38 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x40 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x48 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x50 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x58 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x59 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x61 = 0;
  this_00[1].super_QWidgetPrivate.field_0x69 = 1;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x70 = 0;
  this_00[1].super_QWidgetPrivate.extra._M_t.
  super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
  super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
  super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl = (QWExtra *)0x0;
  this_00[1].super_QWidgetPrivate.focus_next = (QWidget *)0x0;
  this_00[1].super_QWidgetPrivate.focus_prev = (QWidget *)0x0;
  this_00[1].super_QWidgetPrivate.focus_child = (QWidget *)0x0;
  this_00[1].super_QWidgetPrivate.layout = (QLayout *)0x0;
  this_00[1].super_QWidgetPrivate.needsFlush = (QRegion *)0x0;
  this_00[1].super_QWidgetPrivate.redirectDev = (QPaintDevice *)0x0;
  this_00[1].super_QWidgetPrivate.widgetItem = (QWidgetItemV2 *)0x0;
  this_00[1].super_QWidgetPrivate.extraPaintEngine = (QPaintEngine *)0x0;
  QMessageDialogOptions::create();
  QDialog::QDialog(&this->super_QDialog,this_00,parent,(WindowFlags)0x8003100);
  *(undefined ***)&(this->super_QDialog).super_QWidget = &PTR_metaObject_00812540;
  *(undefined ***)&(this->super_QDialog).super_QWidget.super_QPaintDevice =
       &PTR__QMessageBox_00812718;
  local_28 = 0;
  local_38 = (QArrayData *)0x0;
  uStack_30 = 0;
  QMessageBoxPrivate::init
            (*(QMessageBoxPrivate **)&(this->super_QDialog).super_QWidget.field_0x8,
             (EVP_PKEY_CTX *)&local_38);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QMessageBox::QMessageBox(QWidget *parent)
    : QDialog(*new QMessageBoxPrivate, parent, Qt::MSWindowsFixedSizeDialogHint | Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowCloseButtonHint)
{
    Q_D(QMessageBox);
    d->init();
}